

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::AddWaitSemaphore
          (DeviceContextVkImpl *this,ManagedSemaphore *pWaitSemaphore,
          VkPipelineStageFlags WaitDstStageMask)

{
  Char *Message;
  char (*in_RCX) [26];
  value_type_conflict2 local_60;
  VkObjectType local_58 [3];
  undefined1 local_40 [8];
  string msg;
  ManagedSemaphore *pMStack_18;
  VkPipelineStageFlags WaitDstStageMask_local;
  ManagedSemaphore *pWaitSemaphore_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._12_4_ = WaitDstStageMask;
  pMStack_18 = pWaitSemaphore;
  pWaitSemaphore_local = (ManagedSemaphore *)this;
  if (pWaitSemaphore == (ManagedSemaphore *)0x0) {
    FormatString<char[26],char[26]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pWaitSemaphore != nullptr",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"AddWaitSemaphore",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/DeviceContextVkImpl.hpp"
               ,0x154);
    std::__cxx11::string::~string((string *)local_40);
  }
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
  ::
  emplace_back<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>*&>
            ((vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>,std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T*,(VulkanUtilities::VulkanHandleTypeId)17>>>>>
              *)&this->m_WaitManagedSemaphores,&stack0xffffffffffffffe8);
  local_58[0] = ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
                ::Get(pMStack_18);
  std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
            (&this->m_VkWaitSemaphores,local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_WaitDstStageMasks,(value_type *)(msg.field_2._M_local_buf + 0xc));
  local_60 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_WaitSemaphoreValues,&local_60);
  return;
}

Assistant:

void AddWaitSemaphore(ManagedSemaphore* pWaitSemaphore, VkPipelineStageFlags WaitDstStageMask)
    {
        VERIFY_EXPR(pWaitSemaphore != nullptr);
        m_WaitManagedSemaphores.emplace_back(pWaitSemaphore);
        m_VkWaitSemaphores.push_back(pWaitSemaphore->Get());
        m_WaitDstStageMasks.push_back(WaitDstStageMask);
        m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
    }